

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
* __thiscall
Board::get_possible_moves
          (map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
           *__return_storage_ptr__,Board *this,Color color)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  _Rb_tree_impl<std::less<Point>,_true> *p_Var3;
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  *pmVar4;
  char cVar5;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> *this_00;
  dimension y;
  uint uVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  short x;
  set<Point,_std::less<Point>,_std::allocator<Point>_> piece_possible_moves;
  Point local_a8;
  undefined4 local_a4;
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  *local_a0;
  ulong local_98;
  _Rb_tree<Point,_std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>,_std::_Select1st<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  local_90;
  Point local_60 [10];
  long local_38;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000011,color);
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar7 = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = __return_storage_ptr__;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    x = 0;
    y = (dimension)uVar7;
    local_98 = uVar7;
    do {
      Point::Point(local_60,x,y);
      if (*(long *)(*(long *)&(this->m_board).m_data.
                              super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_60[0].m_x].
                              super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                   + (long)local_60[0].m_y * 0x10) != 0) {
        Point::Point(&local_a8,x,y);
        cVar5 = (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                                                                                      
                                                  super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_a8.m_x].
                                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                        + (long)local_a8.m_y * 0x10) + 0x20))();
        if (cVar5 == (char)local_a4) {
          Point::Point(&local_a8,x,y);
          puVar2 = *(undefined8 **)
                    (*(long *)&(this->m_board).m_data.
                               super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_a8.m_x].
                               super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                    + (long)local_a8.m_y * 0x10);
          (**(code **)*puVar2)(local_60,puVar2,this);
          if (local_38 != 0) {
            Point::Point(&local_a8,x,y);
            this_00 = &std::
                       map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
                       ::operator[]((map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
                                     *)&local_90,&local_a8)->_M_t;
            std::
            _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
            ::operator=(this_00,(_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                                 *)local_60);
          }
          std::
          _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
          ~_Rb_tree((_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                     *)local_60);
        }
      }
      pmVar4 = local_a0;
      x = x + 1;
    } while (x != 8);
    uVar6 = (int)local_98 + 1;
    uVar7 = (ulong)uVar6;
  } while ((short)uVar6 != 8);
  p_Var1 = &(local_a0->_M_t)._M_impl.super__Rb_tree_header;
  if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (local_a0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (local_a0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (local_a0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (local_a0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    p_Var3 = &(local_a0->_M_t)._M_impl;
  }
  else {
    p_Var3 = &local_90._M_impl;
    (local_a0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
         local_90._M_impl.super__Rb_tree_header._M_header._M_color;
    (local_a0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_a0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    (local_a0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (local_a0->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
         local_90._M_impl.super__Rb_tree_header._M_node_count;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  (p_Var3->super__Rb_tree_header)._M_node_count = 0;
  std::
  _Rb_tree<Point,_std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>,_std::_Select1st<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  ::~_Rb_tree(&local_90);
  return pmVar4;
}

Assistant:

map<Point, set<Point>> Board::get_possible_moves(Color color) const {
    map<Point, set<Point>> possible_moves;

    for (dimension i = 0; i < SIZE; i++) {
        for (dimension j = 0; j < SIZE; j++) {
            if ((m_board[{j, i}] == nullptr) || (m_board[{j, i}]->get_color() != color)) continue;
            auto piece_possible_moves = m_board[{j, i}]->get_possible_positions(m_board);
            if (!piece_possible_moves.empty()) {
                possible_moves[{j, i}] = piece_possible_moves;
            }
        }
    }

    return move(possible_moves);
}